

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

sc_signed * sc_dt::operator-(sc_signed *u,sc_signed *v)

{
  long in_RDX;
  long in_RSI;
  sc_signed *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  small_type in_stack_0000000c;
  int in_stack_00000020;
  int in_stack_00000028;
  small_type in_stack_ffffffffffffffd4;
  
  if (*(int *)(in_RDX + 8) == 0) {
    sc_signed::sc_signed(in_RDI,in_RDI);
  }
  else if (*(int *)(in_RSI + 8) == 0) {
    sc_signed::sc_signed(in_RDI,in_RDI,in_stack_ffffffffffffffd4);
  }
  else {
    add_signed_friend(in_stack_0000000c,in_stack_00000008,unaff_retaddr,(sc_digit *)in_RDI,
                      (small_type)((ulong)in_RSI >> 0x20),in_stack_00000020,in_stack_00000028,
                      (sc_digit *)v);
  }
  return in_RDI;
}

Assistant:

sc_signed
operator-(const sc_signed& u, const sc_signed& v)
{

  if (v.sgn == SC_ZERO)  // case 1
    return sc_signed(u);

  if (u.sgn == SC_ZERO) // case 2
    return sc_signed(v, -v.sgn);

  // cases 3 and 4
  return add_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           -v.sgn, v.nbits, v.ndigits, v.digit);

}